

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArrayTest.cpp
# Opt level: O2

void __thiscall
compressed_array_check_size_check_Test::~compressed_array_check_size_check_Test
          (compressed_array_check_size_check_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(compressed_array_check, size_check) {
    vector<Record> records;

    records = create_records_1();
    ASSERT_EQ(records.size(), CompressedArray(records).size());

    records = create_records_2();
    ASSERT_EQ(records.size(), CompressedArray(records).size());

    records = create_records_3();
    ASSERT_EQ(records.size(), CompressedArray(records).size());
}